

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall xLearn::Parser::~Parser(Parser *this)

{
  this->_vptr_Parser = (_func_int **)&PTR__Parser_0015a480;
  std::__cxx11::string::~string((string *)&this->splitor_);
  return;
}

Assistant:

virtual ~Parser() {  }